

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O2

void __thiscall Nes_Apu::enable_nonlinear(Nes_Apu *this,double v)

{
  (this->dmc).nonlinear = true;
  Blip_Synth<3,_15>::volume(&this->square_synth,v * 0.11272086207720806);
  Blip_Impulse_::volume_unit(&(this->triangle).synth.impulse,0.005346534653465346);
  Blip_Impulse_::volume_unit(&(this->noise).synth.impulse,0.003564356435643564);
  Blip_Impulse_::volume_unit(&(this->dmc).synth.impulse,0.001782178217821782);
  (this->square1).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->square2).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->triangle).super_Nes_Osc.last_amp = 0;
  (this->noise).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->dmc).super_Nes_Osc.last_amp = 0;
  return;
}

Assistant:

void Nes_Apu::enable_nonlinear( double v )
{
	dmc.nonlinear = true;
	square_synth.volume( 1.3 * 0.25751258 / 0.742467605 * 0.25 * v );
	
	const double tnd = 0.75 / 202 * 0.48;
	triangle.synth.volume_unit( 3 * tnd );
	noise.synth.volume_unit( 2 * tnd );
	dmc.synth.volume_unit( tnd );
	
	buffer_cleared();
}